

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool find_base_glyph_record
                  (FT_Byte *base_glyph_begin,FT_UInt num_base_glyph,FT_UInt glyph_id,
                  BaseGlyphRecord *record)

{
  ushort uVar1;
  uint uVar2;
  FT_Byte *pFVar3;
  FT_UShort gid;
  FT_Byte *p;
  uint local_30;
  FT_UInt mid;
  FT_UInt max;
  FT_UInt min;
  BaseGlyphRecord *record_local;
  FT_UInt glyph_id_local;
  FT_UInt num_base_glyph_local;
  FT_Byte *base_glyph_begin_local;
  
  mid = 0;
  local_30 = num_base_glyph;
  do {
    while( true ) {
      if (local_30 <= mid) {
        return '\0';
      }
      uVar2 = mid + (local_30 - mid >> 1);
      pFVar3 = base_glyph_begin + uVar2 * 6;
      uVar1 = CONCAT11(*pFVar3,pFVar3[1]);
      if (glyph_id <= uVar1) break;
      mid = uVar2 + 1;
    }
    local_30 = uVar2;
  } while (glyph_id < uVar1);
  record->gid = uVar1;
  record->first_layer_index = CONCAT11(pFVar3[2],pFVar3[3]);
  record->num_layers = CONCAT11(pFVar3[4],pFVar3[5]);
  return '\x01';
}

Assistant:

static FT_Bool
  find_base_glyph_record( FT_Byte*          base_glyph_begin,
                          FT_UInt           num_base_glyph,
                          FT_UInt           glyph_id,
                          BaseGlyphRecord*  record )
  {
    FT_UInt  min = 0;
    FT_UInt  max = num_base_glyph;


    while ( min < max )
    {
      FT_UInt   mid = min + ( max - min ) / 2;
      FT_Byte*  p   = base_glyph_begin + mid * BASE_GLYPH_SIZE;

      FT_UShort  gid = FT_NEXT_USHORT( p );


      if ( gid < glyph_id )
        min = mid + 1;
      else if (gid > glyph_id )
        max = mid;
      else
      {
        record->gid               = gid;
        record->first_layer_index = FT_NEXT_USHORT( p );
        record->num_layers        = FT_NEXT_USHORT( p );

        return 1;
      }
    }

    return 0;
  }